

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_enclosed_pointer_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id,bool register_expression_read)

{
  bool bVar1;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  undefined1 local_48 [40];
  SPIRType *type;
  bool register_expression_read_local;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  type._4_4_ = (uint32_t)CONCAT71(in_register_00000011,register_expression_read);
  type._3_1_ = in_CL & 1;
  pCStack_18 = this_00;
  this_local = this;
  local_48._32_8_ = Compiler::expression_type((Compiler *)this_00,type._4_4_);
  if ((((((SPIRType *)local_48._32_8_)->pointer & 1U) == 0) ||
      (bVar1 = Compiler::expression_is_lvalue((Compiler *)this_00,type._4_4_), !bVar1)) ||
     (bVar1 = should_dereference(this_00,type._4_4_), bVar1)) {
    to_enclosed_unpacked_expression_abi_cxx11_(this,id,SUB41(type._4_4_,0));
  }
  else {
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_48,id,SUB41(type._4_4_,0));
    address_of_expression(this,(string *)this_00);
    ::std::__cxx11::string::~string((string *)local_48);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_enclosed_pointer_expression(uint32_t id, bool register_expression_read)
{
	auto &type = expression_type(id);
	if (type.pointer && expression_is_lvalue(id) && !should_dereference(id))
		return address_of_expression(to_enclosed_expression(id, register_expression_read));
	else
		return to_enclosed_unpacked_expression(id, register_expression_read);
}